

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void Fossilize::Hashing::hash_specialization_info(Hasher *h,VkSpecializationInfo *spec)

{
  void *pvVar1;
  VkSpecializationMapEntry *pVVar2;
  ulong uVar3;
  ulong uVar4;
  Hash HVar5;
  long lVar6;
  ulong uVar7;
  
  uVar4 = spec->dataSize;
  HVar5 = h->h;
  if (uVar4 != 0) {
    pvVar1 = spec->pData;
    uVar7 = 0;
    do {
      HVar5 = HVar5 * 0x100000001b3 ^ (ulong)*(byte *)((long)pvVar1 + uVar7);
      h->h = HVar5;
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  uVar7 = (ulong)spec->mapEntryCount;
  uVar4 = ((uVar4 & 0xffffffff ^ HVar5 * 0x100000001b3) * 0x100000001b3 ^ uVar4 >> 0x20) *
          0x100000001b3 ^ uVar7;
  h->h = uVar4;
  if (uVar7 != 0) {
    pVVar2 = spec->pMapEntries;
    lVar6 = 0;
    do {
      uVar3 = *(ulong *)((long)&pVVar2->size + lVar6);
      uVar4 = ((uVar3 & 0xffffffff ^
               (uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar2->offset + lVar6)) *
               0x100000001b3) * 0x100000001b3 ^ uVar3 >> 0x20) * 0x100000001b3 ^
              (ulong)*(uint *)((long)&pVVar2->constantID + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (uVar7 << 4 != lVar6);
    h->h = uVar4;
  }
  return;
}

Assistant:

static void hash_specialization_info(Hasher &h, const VkSpecializationInfo &spec)
{
	h.data(static_cast<const uint8_t *>(spec.pData), spec.dataSize);
	h.u64(spec.dataSize);
	h.u32(spec.mapEntryCount);
	for (uint32_t i = 0; i < spec.mapEntryCount; i++)
	{
		h.u32(spec.pMapEntries[i].offset);
		h.u64(spec.pMapEntries[i].size);
		h.u32(spec.pMapEntries[i].constantID);
	}
}